

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O2

void __thiscall
iutest::detail::iuValuesInParamsGenerator<unsigned_long>::
iuValuesInParamsGenerator<unsigned_long,3ul>
          (iuValuesInParamsGenerator<unsigned_long> *this,unsigned_long (*values) [3])

{
  (this->super_iuIParamGenerator<unsigned_long>)._vptr_iuIParamGenerator =
       (_func_int **)&PTR__iuValuesInParamsGenerator_00181a10;
  (this->m_values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_it)._M_current = (unsigned_long *)0x0;
  std::vector<unsigned_long,std::allocator<unsigned_long>>::insert<unsigned_long_const*,void>
            ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->m_values,
             (const_iterator)0x0,*values,values[1]);
  return;
}

Assistant:

explicit iuValuesInParamsGenerator(const TT (&values)[SIZE])
    {
        m_values.insert(m_values.end(), values, values + SIZE);
    }